

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileUtilitiesTestCase.cpp
# Opt level: O0

char * SuiteFileUtilitiesTests::UnitTestSuite::GetSuiteName(void)

{
  return "FileUtilitiesTests";
}

Assistant:

SUITE(FileUtilitiesTests)
{

TEST(separator)
{
#ifdef _MSC_VER
  CHECK_EQUAL( "\\", file_separator() );
#else
  CHECK_EQUAL( "/", file_separator() );
#endif
}

TEST(appendpath)
{
  CHECK_EQUAL( ("path" + file_separator() + "file"), file_appendpath("path", "file") );
  CHECK_EQUAL( "path/file", file_appendpath("path/", "file") );
  CHECK_EQUAL( "path\\file", file_appendpath("path\\", "file") );
}

}